

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddTxOut
          (ConfidentialTransactionController *this,ElementsConfidentialAddress *address,
          Amount *value,ConfidentialAssetId *asset,bool remove_nonce)

{
  ElementsConfidentialAddress *in_RDX;
  ConfidentialNonce *in_RSI;
  ConfidentialTxOutReference *in_RDI;
  Script *in_R8;
  byte in_R9B;
  ElementsConfidentialAddress confidential_addr;
  ByteData nonce;
  Script locking_script;
  ByteData hash_data;
  ByteData *in_stack_fffffffffffffd08;
  ElementsConfidentialAddress *in_stack_fffffffffffffd10;
  ConfidentialAssetId *in_stack_fffffffffffffd30;
  Amount *in_stack_fffffffffffffd38;
  Script *in_stack_fffffffffffffd40;
  ConfidentialTransactionController *in_stack_fffffffffffffd48;
  ConfidentialKey local_2a8;
  ByteData local_290;
  string local_278;
  ElementsConfidentialAddress local_258;
  ByteData local_a8;
  Script local_80;
  ByteData local_48;
  byte local_29;
  Script *local_28;
  ElementsConfidentialAddress *local_18;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_18 = in_RDX;
  core::ElementsConfidentialAddress::GetHash(&local_48,in_RDX);
  core::ElementsConfidentialAddress::GetLockingScript(&local_80,local_18);
  core::ByteData::ByteData(&local_a8);
  if ((local_29 & 1) == 0) {
    core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_278,local_18);
    core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_258,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    core::ElementsConfidentialAddress::GetConfidentialKey(&local_2a8,&local_258);
    core::Pubkey::GetData(&local_290,&local_2a8);
    core::ByteData::operator=((ByteData *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    core::ByteData::~ByteData((ByteData *)0x5571ba);
    core::Pubkey::~Pubkey((Pubkey *)0x5571c4);
    core::ElementsConfidentialAddress::~ElementsConfidentialAddress(in_stack_fffffffffffffd10);
  }
  core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)&stack0xfffffffffffffd30,&local_a8);
  AddTxOut(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
           in_stack_fffffffffffffd30,in_RSI);
  core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5572eb);
  core::ByteData::~ByteData((ByteData *)0x5572f8);
  core::Script::~Script(local_28);
  core::ByteData::~ByteData((ByteData *)0x557312);
  return in_RDI;
}

Assistant:

const ConfidentialTxOutReference ConfidentialTransactionController::AddTxOut(
    const ElementsConfidentialAddress& address, const Amount& value,
    const ConfidentialAssetId& asset, bool remove_nonce) {
  const ByteData hash_data = address.GetHash();
  Script locking_script = address.GetLockingScript();

  ByteData nonce;
  if (!remove_nonce) {
    ElementsConfidentialAddress confidential_addr(address.GetAddress());
    nonce = confidential_addr.GetConfidentialKey().GetData();
  }
  return AddTxOut(locking_script, value, asset, ConfidentialNonce(nonce));
}